

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O0

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::MergeArchives
          (ArchiverFactoryImpl *this,IDataBlob **ppSrcArchives,Uint32 NumSrcArchives,
          IDataBlob **ppDstArchive)

{
  Char *pCVar1;
  CreateInfo local_288;
  undefined1 local_278 [8];
  DeviceObjectArchive Archive;
  undefined1 auStack_180 [4];
  Uint32 i;
  Uint32 local_178;
  bool local_174;
  undefined1 local_170 [8];
  DeviceObjectArchive MergedArchive;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  IDataBlob **ppDstArchive_local;
  Uint32 NumSrcArchives_local;
  IDataBlob **ppSrcArchives_local;
  ArchiverFactoryImpl *this_local;
  
  if (NumSrcArchives == 0) {
    this_local._7_1_ = false;
  }
  else {
    msg.field_2._8_8_ = ppDstArchive;
    if (ppSrcArchives == (IDataBlob **)0x0) {
      FormatString<char[31]>((string *)local_50,(char (*) [31])"ppSrcArchives must not be null");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"MergeArchives",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                 ,0x12f);
      std::__cxx11::string::~string((string *)local_50);
    }
    if (msg.field_2._8_8_ == 0) {
      FormatString<char[30]>
                ((string *)&MergedArchive.m_ContentVersion,
                 (char (*) [30])"ppDstArchive must not be null");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"MergeArchives",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                 ,0x130);
      std::__cxx11::string::~string((string *)&MergedArchive.m_ContentVersion);
    }
    if ((ppSrcArchives == (IDataBlob **)0x0) || (msg.field_2._8_8_ == 0)) {
      this_local._7_1_ = false;
    }
    else {
      _auStack_180 = *ppSrcArchives;
      local_178 = 0xffffffff;
      local_174 = false;
      DeviceObjectArchive::DeviceObjectArchive
                ((DeviceObjectArchive *)local_170,(CreateInfo *)auStack_180);
      for (Archive._236_4_ = 1; (uint)Archive._236_4_ < NumSrcArchives;
          Archive._236_4_ = Archive._236_4_ + 1) {
        local_288.pData = ppSrcArchives[(uint)Archive._236_4_];
        local_288.ContentVersion = 0xffffffff;
        local_288.MakeCopy = false;
        DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)local_278,&local_288);
        DeviceObjectArchive::Merge
                  ((DeviceObjectArchive *)local_170,(DeviceObjectArchive *)local_278);
        DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)local_278);
      }
      DeviceObjectArchive::Serialize
                ((DeviceObjectArchive *)local_170,(IDataBlob **)msg.field_2._8_8_);
      this_local._7_1_ = *(long *)msg.field_2._8_8_ != 0;
      DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)local_170);
    }
  }
  return this_local._7_1_;
}

Assistant:

Bool ArchiverFactoryImpl::MergeArchives(
    const IDataBlob* ppSrcArchives[],
    Uint32           NumSrcArchives,
    IDataBlob**      ppDstArchive) const
{
    if (NumSrcArchives == 0)
        return false;

    DEV_CHECK_ERR(ppSrcArchives != nullptr, "ppSrcArchives must not be null");
    DEV_CHECK_ERR(ppDstArchive != nullptr, "ppDstArchive must not be null");

    if (ppSrcArchives == nullptr || ppDstArchive == nullptr)
        return false;

    try
    {
        DeviceObjectArchive MergedArchive{DeviceObjectArchive::CreateInfo{ppSrcArchives[0]}};
        for (Uint32 i = 1; i < NumSrcArchives; ++i)
        {
            const DeviceObjectArchive Archive{DeviceObjectArchive::CreateInfo{ppSrcArchives[i]}};
            MergedArchive.Merge(Archive);
        }

        MergedArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}